

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

int get_switchable_rate(MACROBLOCK *x,int_interpfilters filters,int *ctx,int dual_filter)

{
  InterpFilter filter1;
  int inter_filter_cost;
  InterpFilter filter0;
  int dual_filter_local;
  int *ctx_local;
  MACROBLOCK *x_local;
  int_interpfilters filters_local;
  
  inter_filter_cost = (x->mode_costs).switchable_interp_costs[*ctx][(byte)filters.as_int];
  if (dual_filter != 0) {
    inter_filter_cost =
         (x->mode_costs).switchable_interp_costs[ctx[1]][(byte)((uint)filters >> 0x10)] +
         inter_filter_cost;
  }
  return inter_filter_cost;
}

Assistant:

static inline int get_switchable_rate(MACROBLOCK *const x,
                                      const int_interpfilters filters,
                                      const int ctx[2], int dual_filter) {
  const InterpFilter filter0 = filters.as_filters.y_filter;
  int inter_filter_cost =
      x->mode_costs.switchable_interp_costs[ctx[0]][filter0];
  if (dual_filter) {
    const InterpFilter filter1 = filters.as_filters.x_filter;
    inter_filter_cost += x->mode_costs.switchable_interp_costs[ctx[1]][filter1];
  }
  return SWITCHABLE_INTERP_RATE_FACTOR * inter_filter_cost;
}